

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AssignmentPatternItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssignmentPatternItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ExpressionSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  AssignmentPatternItemSyntax *pAVar6;
  
  pAVar6 = (AssignmentPatternItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AssignmentPatternItemSyntax *)this->endPtr < pAVar6 + 1) {
    pAVar6 = (AssignmentPatternItemSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pAVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pAVar6->super_SyntaxNode).kind = AssignmentPatternItem;
  (pAVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pAVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pAVar6->key).ptr = args;
  (pAVar6->colon).kind = TVar2;
  (pAVar6->colon).field_0x2 = uVar3;
  (pAVar6->colon).numFlags = (NumericTokenFlags)NVar4.raw;
  (pAVar6->colon).rawLen = uVar5;
  (pAVar6->colon).info = pIVar1;
  (pAVar6->expr).ptr = args_2;
  (args->super_SyntaxNode).parent = &pAVar6->super_SyntaxNode;
  (args_2->super_SyntaxNode).parent = &pAVar6->super_SyntaxNode;
  return pAVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }